

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::SetBreakpointsRequest>::destruct
          (BasicTypeInfo<dap::SetBreakpointsRequest> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::SetBreakpointsRequest> *this_local;
  
  SetBreakpointsRequest::~SetBreakpointsRequest((SetBreakpointsRequest *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }